

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::EQZ_2LTZ::EQZ_2LTZ(EQZ_2LTZ *this,Mat *res,Mat *a,int k)

{
  Mat *a_00;
  LTZ *this_00;
  Mat *res_00;
  Mat *this_01;
  void *pvVar1;
  void *pvVar2;
  _func_int **pp_Var3;
  undefined4 in_ECX;
  Mat *in_RDX;
  _func_int **in_RSI;
  Op *in_RDI;
  int tmp_c;
  int tmp_r;
  undefined8 in_stack_ffffffffffffff98;
  Mat *in_stack_ffffffffffffffa0;
  Mat *in_stack_ffffffffffffffc8;
  Reveal *in_stack_ffffffffffffffd0;
  
  Op::Op(in_RDI);
  in_RDI->_vptr_Op = (_func_int **)&PTR_forward_001547c0;
  in_RDI[1]._vptr_Op = in_RSI;
  *(Mat **)&in_RDI[1].forwardRound = in_RDX;
  *(undefined4 *)&in_RDI[3]._vptr_Op = in_ECX;
  Mat::rows(in_RDX);
  Mat::cols(in_RDX);
  a_00 = (Mat *)operator_new(0x28);
  Mat::Mat(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
           (int)in_stack_ffffffffffffff98);
  *(Mat **)&in_RDI[1].backRound = a_00;
  this_00 = (LTZ *)operator_new(0x28);
  Mat::Mat(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
           (int)in_stack_ffffffffffffff98);
  in_RDI[2]._vptr_Op = (_func_int **)this_00;
  res_00 = (Mat *)operator_new(0x28);
  Mat::Mat(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
           (int)in_stack_ffffffffffffff98);
  *(Mat **)&in_RDI[1].localRound = res_00;
  this_01 = (Mat *)operator_new(0x28);
  Mat::Mat(this_01,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
  *(Mat **)&in_RDI[2].forwardRound = this_01;
  pvVar1 = operator_new(0x70);
  LTZ::LTZ(this_00,res_00,this_01,(int)((ulong)pvVar1 >> 0x20));
  *(void **)&in_RDI[2].backRound = pvVar1;
  pvVar2 = operator_new(0x70);
  LTZ::LTZ(this_00,res_00,this_01,(int)((ulong)pvVar1 >> 0x20));
  *(void **)&in_RDI[2].localRound = pvVar2;
  pvVar1 = operator_new(0x40);
  Reveal::Reveal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,a_00);
  *(void **)&in_RDI[3].localRound = pvVar1;
  pp_Var3 = (_func_int **)operator_new(0x40);
  Reveal::Reveal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,a_00);
  in_RDI[4]._vptr_Op = pp_Var3;
  pvVar1 = operator_new(0x40);
  Reveal::Reveal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,a_00);
  *(void **)&in_RDI[4].forwardRound = pvVar1;
  Op::init(in_RDI,(EVP_PKEY_CTX *)0x4);
  return;
}

Assistant:

MathOp::EQZ_2LTZ::EQZ_2LTZ(Mat* res, Mat *a, int k) {
    this->res = res;
    this->a = a;
    this->k = k;
    int tmp_r, tmp_c;
    tmp_r = a->rows();
    tmp_c = a->cols();

    u_st = new Mat(tmp_r, tmp_c);
    u_st_res = new Mat(tmp_r, tmp_c);
    u_nd = new Mat(tmp_r, tmp_c);
    u_nd_res = new Mat(tmp_r, tmp_c);
    pLTZ_f_1 = new LTZ(u_st_res, u_st, BIT_P_LEN);
    pLTZ_f_2 = new LTZ(u_nd_res, u_nd, BIT_P_LEN);
    reveal = new Reveal(res, res);
    reveal_1 = new Reveal(u_st_res, u_st_res);
    reveal_2 = new Reveal(u_nd_res, u_nd_res);
    init(4, 0);
}